

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scenario.cpp
# Opt level: O0

void __thiscall
multi_agent_planning::Scenario::Scenario
          (Scenario *this,
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          *actions,vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                   *graphs,int numInteractions)

{
  int iVar1;
  Interaction i_00;
  edge_descriptor e;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> a;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> b;
  size_type sVar2;
  const_reference pvVar3;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
  __result;
  reference pvVar4;
  const_reference x;
  edge_bundled *peVar5;
  bool local_281;
  undefined1 auStack_1a8 [8];
  Interaction interaction;
  int interactionCost;
  undefined1 local_130 [4];
  int cost;
  Graph g;
  pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_> action;
  pair<int,_int> local_c0;
  _Self local_b8;
  pair<int,_int> local_b0;
  _Self local_a8;
  int local_9c;
  int local_98;
  int actB;
  int actA;
  int i_1;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  generated;
  anon_class_4_1_54a39809 local_38;
  int i;
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  local_25;
  int local_24;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  *pvStack_20;
  int numInteractions_local;
  vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
  *graphs_local;
  vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
  *actions_local;
  Scenario *this_local;
  
  local_24 = numInteractions;
  pvStack_20 = graphs;
  graphs_local = (vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
                  *)actions;
  actions_local =
       (vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
        *)this;
  sVar2 = std::
          vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
          ::size(actions);
  std::
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  ::allocator(&local_25);
  std::
  vector<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>,_std::allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>_>
  ::vector(&this->interactionMaps,sVar2,&local_25);
  std::
  allocator<std::map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<multi_agent_planning::Interaction,_std::allocator<multi_agent_planning::Interaction>_>_>_>_>_>
  ::~allocator(&local_25);
  memset(&this->allActions,0,0x18);
  std::
  vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
  ::vector(&this->allActions);
  for (local_38.i = 0;
      sVar2 = std::
              vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
              ::size((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                      *)graphs_local), (ulong)(long)local_38.i < sVar2; local_38.i = local_38.i + 1)
  {
    pvVar3 = std::
             vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
             ::operator[]((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                           *)graphs_local,(long)local_38.i);
    __first = std::
              vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
              ::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
             ::operator[]((vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>,_std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>_>
                           *)graphs_local,(long)local_38.i);
    __last = std::
             vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>
             ::end(pvVar3);
    __result = std::
               back_inserter<std::vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>
                         (&this->allActions);
    generated._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 transform<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>const*,std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>,std::back_insert_iterator<std::vector<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>,std::allocator<std::pair<int,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>,multi_agent_planning::Scenario::Scenario(std::vector<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>,std::allocator<std::vector<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>>>>>const&,std::vector<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>,std::allocator<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,multi_agent_planning::Action,boost::no_property,boost::listS>>>const&,int)::__0>
                           ((__normal_iterator<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                             )__first._M_current,
                            (__normal_iterator<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
                             )__last._M_current,__result,local_38);
  }
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&actA);
  for (actB = 0; actB < local_24; actB = actB + 1) {
    do {
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_98 = getRndInt((int)sVar2 + -1);
      sVar2 = std::
              vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
              ::size(&this->allActions);
      local_9c = getRndInt((int)sVar2 + -1);
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_98);
      iVar1 = pvVar4->first;
      pvVar4 = std::
               vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
               ::operator[](&this->allActions,(long)local_9c);
      local_281 = true;
      if (iVar1 != pvVar4->first) {
        local_b0 = std::make_pair<int&,int&>(&local_98,&local_9c);
        local_a8._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)&actA,&local_b0);
        local_b8._M_node =
             (_Base_ptr)
             std::
             set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                    *)&actA);
        local_281 = std::operator!=(&local_a8,&local_b8);
      }
    } while (local_281 != false);
    local_c0 = std::make_pair<int&,int&>(&local_98,&local_9c);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&actA,&local_c0);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_9c);
    g.m_property.px = *(no_property **)pvVar4;
    e.super_edge_base<boost::directed_tag,_unsigned_long> =
         (pvVar4->second).super_edge_base<boost::directed_tag,_unsigned_long>;
    e.m_eproperty = (pvVar4->second).m_eproperty;
    x = std::
        vector<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>,_std::allocator<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>_>_>
        ::operator[](pvStack_20,(long)(int)g.m_property.px);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                      *)local_130,x);
    peVar5 = boost::
             adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
             ::operator[]((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                           *)local_130,e);
    iVar1 = peVar5->cost;
    do {
      interaction._68_4_ = getRndInt(-iVar1,iVar1);
    } while (interaction._68_4_ == 0);
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_98);
    a.first = pvVar4->first;
    a._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
    a.second = pvVar4->second;
    pvVar4 = std::
             vector<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<int,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>_>_>
             ::operator[](&this->allActions,(long)local_9c);
    b.first = pvVar4->first;
    b._4_4_ = *(undefined4 *)&pvVar4->field_0x4;
    b.second = pvVar4->second;
    Interaction::Interaction((Interaction *)auStack_1a8,a,b,interaction._68_4_);
    i_00.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction._0_8_;
    i_00._0_8_ = auStack_1a8;
    i_00.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_00.actionA.m_eproperty =
         (property_type *)
         interaction.actionA.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_00._32_8_ = interaction.actionA.m_eproperty;
    i_00.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source = interaction._32_8_;
    i_00.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target =
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_source;
    i_00.actionB.m_eproperty =
         (property_type *)
         interaction.actionB.super_edge_base<boost::directed_tag,_unsigned_long>.m_target;
    i_00._64_8_ = interaction.actionB.m_eproperty;
    insertInteraction(this,i_00);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
    ::~adjacency_list((adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_multi_agent_planning::Action,_boost::no_property,_boost::listS>
                       *)local_130);
  }
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  ~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        *)&actA);
  return;
}

Assistant:

Scenario::Scenario(const std::vector<std::vector<Edge> >& actions, 
									 const std::vector<Graph>& graphs, int numInteractions) : 
		interactionMaps(actions.size()), allActions() {

	for (int i = 0; i < actions.size(); ++i) {
		transform(actions[i].begin(), actions[i].end(), 
							back_inserter(allActions), 
							[i](const Edge& e){return make_pair(i, e);});
	}

	set<pair<int, int> > generated;

	for (int i = 0; i < numInteractions; ++i) {

		int actA, actB;
		
		do {
			actA = getRndInt(allActions.size()-1);
			actB = getRndInt(allActions.size()-1);
		} while ((allActions[actA].first == allActions[actB].first) || 
					  (generated.find(make_pair(actA, actB)) != generated.end()));

		generated.insert(make_pair(actA, actB));
 
 		std::pair<int, Edge> action = allActions[actB];

 		Graph g = graphs[action.first];
 		int cost = g[action.second].cost;

 		int interactionCost;
 		do {
 			interactionCost = getRndInt(-cost, cost);
 		} while (interactionCost == 0);

		Interaction interaction(allActions[actA], allActions[actB], interactionCost);
		insertInteraction(interaction);
	}

}